

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O2

bool __thiscall QAbstractSlider::event(QAbstractSlider *this,QEvent *e)

{
  bool bVar1;
  
  bVar1 = QWidget::event(&this->super_QWidget,e);
  return bVar1;
}

Assistant:

bool QAbstractSlider::event(QEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    Q_D(QAbstractSlider);
    switch (e->type()) {
    case QEvent::FocusIn:
        d->origValue = d->value;
        break;
    default:
        break;
    }
#endif

    return QWidget::event(e);
}